

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O0

any * __thiscall
shadow::constructor_detail::generic_constructor_bind_point<long_double,long_double>
          (any *__return_storage_ptr__,constructor_detail *this,any *argument_array)

{
  any *argument_array_local;
  
  braced_init_selector_impl<void,long_double,long_double>::constructor_dispatch<0ul>
            (__return_storage_ptr__,(braced_init_selector_impl<void,long_double,long_double> *)this)
  ;
  return __return_storage_ptr__;
}

Assistant:

any
generic_constructor_bind_point(any* argument_array)
{
    typedef std::index_sequence_for<ParamTypes...> param_sequence;

    return braced_init_selector<T, ParamTypes...>::constructor_dispatch(
        argument_array, param_sequence());
}